

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O1

void P_CopySlopes(void)

{
  double dVar1;
  line_t_conflict *plVar2;
  uint uVar3;
  sector_t_conflict *psVar4;
  sector_t_conflict **ppsVar5;
  sector_t_conflict **ppsVar6;
  sector_t_conflict *psVar7;
  ulong uVar8;
  long lVar9;
  
  if (0 < numlines) {
    lVar9 = 0;
    do {
      if (lines[lVar9].special == 0x76) {
        lines[lVar9].special = 0;
        psVar7 = lines[lVar9].backsector;
        plVar2 = lines + lVar9;
        uVar8 = 0;
        do {
          if (plVar2->args[uVar8] != 0) {
            if ((uVar8 & 2) == 0) {
              psVar7 = plVar2->frontsector;
            }
            P_CopyPlane(plVar2->args[uVar8],psVar7,(bool)((byte)uVar8 & 1));
          }
          uVar8 = uVar8 + 1;
          psVar7 = lines[lVar9].backsector;
          plVar2 = lines + lVar9;
        } while (uVar8 < (ulong)(psVar7 != (sector_t_conflict *)0x0) * 2 + 2);
        if (psVar7 != (sector_t_conflict *)0x0) {
          uVar3 = plVar2->args[4] & 3;
          if (uVar3 == 2) {
            psVar4 = plVar2->frontsector;
LAB_00452ffc:
            (psVar4->floorplane).normal.Z = (psVar7->floorplane).normal.Z;
            (psVar4->floorplane).normal.Y = (psVar7->floorplane).normal.Y;
            (psVar4->floorplane).normal.X = (psVar7->floorplane).normal.X;
            dVar1 = (psVar7->floorplane).negiC;
            (psVar4->floorplane).D = (psVar7->floorplane).D;
            (psVar4->floorplane).negiC = dVar1;
          }
          else if (uVar3 == 1) {
            psVar4 = psVar7;
            psVar7 = plVar2->frontsector;
            goto LAB_00452ffc;
          }
          uVar3 = plVar2->args[4] & 0xc;
          if (uVar3 == 8) {
            ppsVar6 = &plVar2->frontsector;
            ppsVar5 = &plVar2->backsector;
          }
          else {
            if (uVar3 != 4) goto LAB_004530a8;
            ppsVar5 = &plVar2->frontsector;
            ppsVar6 = &plVar2->backsector;
          }
          psVar7 = *ppsVar5;
          psVar4 = *ppsVar6;
          (psVar4->ceilingplane).normal.Z = (psVar7->ceilingplane).normal.Z;
          (psVar4->ceilingplane).normal.Y = (psVar7->ceilingplane).normal.Y;
          (psVar4->ceilingplane).normal.X = (psVar7->ceilingplane).normal.X;
          dVar1 = (psVar7->ceilingplane).negiC;
          (psVar4->ceilingplane).D = (psVar7->ceilingplane).D;
          (psVar4->ceilingplane).negiC = dVar1;
        }
      }
LAB_004530a8:
      lVar9 = lVar9 + 1;
    } while (lVar9 < numlines);
  }
  return;
}

Assistant:

void P_CopySlopes()
{
	for (int i = 0; i < numlines; i++)
	{
		if (lines[i].special == Plane_Copy)
		{
			// The args are used for the tags of sectors to copy:
			// args[0]: front floor
			// args[1]: front ceiling
			// args[2]: back floor
			// args[3]: back ceiling
			// args[4]: copy slopes from one side of the line to the other.
			lines[i].special = 0;
			for (int s = 0; s < (lines[i].backsector ? 4 : 2); s++)
			{
				if (lines[i].args[s])
					P_CopyPlane(lines[i].args[s], 
					(s & 2 ? lines[i].backsector : lines[i].frontsector), s & 1);
			}

			if (lines[i].backsector != NULL)
			{
				if ((lines[i].args[4] & 3) == 1)
				{
					lines[i].backsector->floorplane = lines[i].frontsector->floorplane;
				}
				else if ((lines[i].args[4] & 3) == 2)
				{
					lines[i].frontsector->floorplane = lines[i].backsector->floorplane;
				}
				if ((lines[i].args[4] & 12) == 4)
				{
					lines[i].backsector->ceilingplane = lines[i].frontsector->ceilingplane;
				}
				else if ((lines[i].args[4] & 12) == 8)
				{
					lines[i].frontsector->ceilingplane = lines[i].backsector->ceilingplane;
				}
			}
		}
	}
}